

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O0

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::async_accept(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
               *this)

{
  element_type *peVar1;
  socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
  *in_RDI;
  shared_ptr<cppcms::impl::cgi::scgi> api;
  scgi *__p;
  shared_ptr<cppcms::impl::cgi::connection> *in_stack_ffffffffffffffb0;
  stream_socket *psVar2;
  service *in_stack_ffffffffffffffb8;
  callback *pcVar3;
  callback<void_(const_std::error_code_&)> *in_stack_ffffffffffffffc8;
  accept_binder in_stack_ffffffffffffffd0;
  accept_binder local_28 [2];
  
  if ((in_RDI->stopped_ & 1U) == 0) {
    server_api_factory<cppcms::impl::cgi::scgi>::operator()
              ((server_api_factory<cppcms::impl::cgi::scgi> *)in_RDI,in_stack_ffffffffffffffb8);
    __p = (scgi *)&stack0xffffffffffffffe8;
    std::shared_ptr<cppcms::impl::cgi::scgi>::shared_ptr<cppcms::impl::cgi::scgi,void>
              ((shared_ptr<cppcms::impl::cgi::scgi> *)in_stack_ffffffffffffffb0,__p);
    std::shared_ptr<cppcms::impl::cgi::connection>::operator=
              (in_stack_ffffffffffffffb0,(shared_ptr<cppcms::impl::cgi::scgi> *)__p);
    peVar1 = std::
             __shared_ptr_access<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x49443f);
    in_RDI->asio_socket_ = &peVar1->socket_;
    psVar2 = (stream_socket *)&in_RDI->acceptor_;
    pcVar3 = (callback *)in_RDI->asio_socket_;
    accept_binder::accept_binder(local_28,in_RDI);
    booster::callback<void(std::error_code_const&)>::
    callback<cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::scgi,cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>>::accept_binder>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
    booster::aio::acceptor::async_accept(psVar2,pcVar3);
    booster::callback<void_(const_std::error_code_&)>::~callback
              ((callback<void_(const_std::error_code_&)> *)0x4944a0);
    std::shared_ptr<cppcms::impl::cgi::scgi>::~shared_ptr
              ((shared_ptr<cppcms::impl::cgi::scgi> *)0x4944aa);
  }
  return;
}

Assistant:

virtual void async_accept()
			{
				if(stopped_)
					return;
				booster::shared_ptr<ServerAPI> api(factory_(srv_));
				api_=api;
				asio_socket_ = &api->socket_;
				acceptor_.async_accept(*asio_socket_,accept_binder(this));
			}